

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_isPrototypeOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  ulong uVar2;
  int iVar3;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  uint uVar6;
  int64_t iVar7;
  JSValue JVar8;
  JSValue JVar9;
  
  iVar1 = argv->tag;
  iVar7 = 1;
  if ((int)iVar1 == -1) {
    JVar5 = (JSValueUnion)(argv->u).ptr;
    JVar8 = JS_ToObject(ctx,this_val);
    JVar4 = JVar8.u;
    uVar6 = (uint)JVar8.tag;
    if (uVar6 != 6) {
      *(int *)JVar5.ptr = *JVar5.ptr + 1;
      JVar9.tag = iVar1;
      JVar9.u.ptr = JVar5.ptr;
      JVar9 = JS_GetPrototypeFree(ctx,JVar9);
      while( true ) {
        JVar5 = JVar9.u;
        uVar2 = JVar9.tag & 0xffffffff;
        if (uVar2 == 6) break;
        if ((uVar2 == 2) || (JVar4.ptr == JVar5.ptr)) {
          if ((0xfffffff4 < (uint)JVar9.tag) &&
             (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar9);
          }
          if ((0xfffffff4 < uVar6) &&
             (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar8);
          }
          JVar5._1_7_ = 0;
          JVar5.int32._0_1_ = uVar2 != 2;
          goto LAB_0016378d;
        }
        iVar3 = ctx->interrupt_counter;
        ctx->interrupt_counter = iVar3 + -1;
        if ((iVar3 < 2) && (iVar3 = __js_poll_interrupts(ctx), iVar3 != 0)) break;
        JVar9 = JS_GetPrototypeFree(ctx,JVar9);
      }
      if ((0xfffffff4 < (uint)JVar9.tag) &&
         (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar9);
      }
      if ((0xfffffff4 < uVar6) && (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
    }
    JVar5.float64 = 0.0;
    iVar7 = 6;
  }
  else {
    JVar5.float64 = 0.0;
  }
LAB_0016378d:
  JVar8.tag = iVar7;
  JVar8.u.float64 = JVar5.float64;
  return JVar8;
}

Assistant:

static JSValue js_object_isPrototypeOf(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue obj, v1;
    JSValueConst v;
    int res;

    v = argv[0];
    if (!JS_IsObject(v))
        return JS_FALSE;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    v1 = JS_DupValue(ctx, v);
    for(;;) {
        v1 = JS_GetPrototypeFree(ctx, v1);
        if (JS_IsException(v1))
            goto exception;
        if (JS_IsNull(v1)) {
            res = FALSE;
            break;
        }
        if (JS_VALUE_GET_OBJ(obj) == JS_VALUE_GET_OBJ(v1)) {
            res = TRUE;
            break;
        }
        /* avoid infinite loop (possible with proxies) */
        if (js_poll_interrupts(ctx))
            goto exception;
    }
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

exception:
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}